

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O2

void __thiscall VGMPlayer::Cmd_YM2612PCM_Delay(VGMPlayer *this)

{
  pointer puVar1;
  CHIP_DEVICE *cDev;
  
  cDev = GetDevicePtr(this,'\x02','\0');
  if ((cDev != (CHIP_DEVICE *)0x0) && (cDev->write8 != (DEVFUNC_WRITE_A8D8)0x0)) {
    puVar1 = this->_pcmBank[0].data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)this->_ym2612pcm_bnkPos <
        (ulong)((long)this->_pcmBank[0].data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1)) {
      SendYMCommand(cDev,'\0','*',puVar1[this->_ym2612pcm_bnkPos]);
      this->_ym2612pcm_bnkPos = this->_ym2612pcm_bnkPos + 1;
      this->_fileTick = this->_fileTick + (this->_fileData[this->_filePos] & 0xf);
    }
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_YM2612PCM_Delay(void)
{
	CHIP_DEVICE* cDev = GetDevicePtr(0x02, 0);
	if (cDev == NULL || cDev->write8 == NULL)
		return;
	if (_ym2612pcm_bnkPos >= _pcmBank[0].data.size())
		return;
	
	UINT8 data = _pcmBank[0].data[_ym2612pcm_bnkPos];
	SendYMCommand(cDev, 0x00, 0x2A, data);
	_ym2612pcm_bnkPos ++;
	// TODO: clip when exceeding pcmBank size
	
	_fileTick += (fData[0x00] & 0x0F);
	return;
}